

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_TestShell::createTest
          (TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_TestShell *this)

{
  TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_Test *this_00;
  
  this_00 = (TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_Test *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
                         ,0xc9);
  TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_Test::
  TEST_MockFailureTest_MockUnexpectedUnmodifiedOutputParameterFailure_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedUnmodifiedOutputParameterFailure)
{
    int out1;
    call1->withName("foo").withOutputParameterReturning("boo", &out1, sizeof(out1));
    call2->withName("foo").withUnmodifiedOutputParameter("boo");
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue((void *)0x123);

    MockUnexpectedOutputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected output parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected output parameter passed to function: foo\n"
                 "\t\tvoid* bar", failure.getMessage().asCharString());
}